

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O0

void make_blinded(long xtime,boolean talk)

{
  uint uVar1;
  boolean bVar2;
  char *pcVar3;
  bool bVar4;
  char *local_168;
  int local_15c;
  char *local_148;
  int local_13c;
  bool local_12c;
  byte local_12b;
  bool local_12a;
  byte local_129;
  char local_128 [8];
  char buf [256];
  int eyecnt;
  boolean can_see_now;
  boolean u_could_see;
  long old;
  boolean talk_local;
  long xtime_local;
  
  uVar1 = u.uprops[0x1e].intrinsic;
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (local_129 = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    local_12a = false;
    if (ublindf != (obj *)0x0) {
      local_12a = ublindf->oartifact == '\x1d';
    }
    local_129 = local_12a ^ 0xff;
  }
  buf[0xff] = (local_129 ^ 0xff) & 1;
  if (((xtime != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
     (local_12b = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
    local_12c = false;
    if (ublindf != (obj *)0x0) {
      local_12c = ublindf->oartifact == '\x1d';
    }
    local_12b = local_12c ^ 0xff;
  }
  buf[0xfe] = (local_12b ^ 0xff) & 1;
  old._7_1_ = talk;
  if (u.usleep != 0) {
    old._7_1_ = '\0';
  }
  if ((buf[0xfe] == 0) || (buf[0xff] != 0)) {
    if ((u.uprops[0x1e].intrinsic != 0) && ((xtime == 0 && (old._7_1_ != '\0')))) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          bVar4 = false;
          if (u.uprops[0x23].intrinsic != 0) {
            bVar4 = true;
            if ((u.uprops[0x24].extrinsic == 0) && (bVar4 = false, u.umonnum != u.umonster)) {
              bVar2 = dmgtype(youmonst.data,0x24);
              bVar4 = bVar2 != '\0';
            }
            bVar4 = (bool)(bVar4 ^ 1);
          }
          pcVar3 = "normal";
          if (bVar4) {
            pcVar3 = "sadder";
          }
          pline("Your vision seems to %s for a moment but is %s now.","brighten",pcVar3);
        }
        else {
          pcVar3 = body_part(1);
          strcpy(local_128,pcVar3);
          if (((youmonst.data)->mflags1 & 0x1000) == 0) {
            local_13c = 2;
            if (youmonst.data == mons + 0x17b || youmonst.data == mons + 0x1e) {
              local_13c = 1;
            }
          }
          else {
            local_13c = 0;
          }
          buf[0xf8] = (undefined1)local_13c;
          buf[0xf9] = local_13c._1_1_;
          buf[0xfa] = local_13c._2_1_;
          buf[0xfb] = local_13c._3_1_;
          if (local_13c == 1) {
            local_148 = local_128;
          }
          else {
            local_148 = makeplural(local_128);
          }
          pcVar3 = "twitch";
          if (buf._248_4_ == 1) {
            pcVar3 = "twitches";
          }
          pline("Your %s momentarily %s.",local_148,pcVar3 + 2);
        }
      }
      else {
        strange_feeling((obj *)0x0,(char *)0x0);
      }
    }
  }
  else if (old._7_1_ != '\0') {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      pline("You can see again.");
    }
    else {
      pline("Far out!  Everything is all cosmic again!");
    }
  }
  if ((buf[0xff] == '\0') || (buf[0xfe] != '\0')) {
    if ((uVar1 == 0) && ((xtime != 0 && (old._7_1_ != '\0')))) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          bVar4 = false;
          if (u.uprops[0x23].intrinsic != 0) {
            bVar4 = true;
            if ((u.uprops[0x24].extrinsic == 0) && (bVar4 = false, u.umonnum != u.umonster)) {
              bVar2 = dmgtype(youmonst.data,0x24);
              bVar4 = bVar2 != '\0';
            }
            bVar4 = (bool)(bVar4 ^ 1);
          }
          pcVar3 = "normal";
          if (bVar4) {
            pcVar3 = "happier";
          }
          pline("Your vision seems to %s for a moment but is %s now.","dim",pcVar3);
        }
        else {
          pcVar3 = body_part(1);
          strcpy(local_128,pcVar3);
          if (((youmonst.data)->mflags1 & 0x1000) == 0) {
            local_15c = 2;
            if (youmonst.data == mons + 0x17b || youmonst.data == mons + 0x1e) {
              local_15c = 1;
            }
          }
          else {
            local_15c = 0;
          }
          buf[0xf8] = (undefined1)local_15c;
          buf[0xf9] = local_15c._1_1_;
          buf[0xfa] = local_15c._2_1_;
          buf[0xfb] = local_15c._3_1_;
          if (local_15c == 1) {
            local_168 = local_128;
          }
          else {
            local_168 = makeplural(local_128);
          }
          pcVar3 = "twitch";
          if (buf._248_4_ == 1) {
            pcVar3 = "twitches";
          }
          pline("Your %s momentarily %s.",local_168,pcVar3);
        }
      }
      else {
        strange_feeling((obj *)0x0,(char *)0x0);
      }
    }
  }
  else {
    if (old._7_1_ != '\0') {
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
        pline("A cloud of darkness falls upon you.");
      }
      else {
        pline("Oh, bummer!  Everything is dark!  Help!");
      }
    }
    if (uball != (obj *)0x0) {
      set_bc(0);
    }
  }
  set_itimeout(&u.uprops[0x1e].intrinsic,xtime);
  if (buf[0xff] != buf[0xfe]) {
    iflags.botl = '\x01';
    vision_full_recalc = '\x01';
    if (((((((u.uprops[0x19].intrinsic != 0) || (u.uprops[0x19].extrinsic != 0)) ||
           (youmonst.data == mons + 0x1e)) ||
          ((youmonst.data == mons + 0x31 || (youmonst.data == mons + 0x32)))) &&
         (u.uprops[0x19].blocked == 0)) ||
        ((u.uprops[0x40].intrinsic != 0 || (u.uprops[0x40].extrinsic != 0)))) ||
       (((youmonst.data)->mflags3 & 0x100) != 0)) {
      see_monsters();
    }
  }
  return;
}

Assistant:

void make_blinded(long xtime, boolean talk)
{
	long old = Blinded;
	boolean u_could_see, can_see_now;
	int eyecnt;
	char buf[BUFSZ];

	/* we need to probe ahead in case the Eyes of the Overworld
	   are or will be overriding blindness */
	u_could_see = !Blind;
	Blinded = xtime ? 1L : 0L;
	can_see_now = !Blind;
	Blinded = old;		/* restore */

	if (u.usleep) talk = FALSE;

	if (can_see_now && !u_could_see) {	/* regaining sight */
	    if (talk) {
		if (Hallucination)
		    pline("Far out!  Everything is all cosmic again!");
		else
		    pline("You can see again.");
	    }
	} else if (old && !xtime) {
	    /* clearing temporary blindness without toggling blindness */
	    if (talk) {
		if (!haseyes(youmonst.data)) {
		    strange_feeling(NULL, NULL);
		} else if (Blindfolded) {
		    strcpy(buf, body_part(EYE));
		    eyecnt = eyecount(youmonst.data);
		    pline(eyemsg, (eyecnt == 1) ? buf : makeplural(buf),
			 (eyecnt == 1) ? "itches" : "itch");
		} else {	/* Eyes of the Overworld */
		    pline(vismsg, "brighten",
			 Hallucination ? "sadder" : "normal");
		}
	    }
	}

	if (u_could_see && !can_see_now) {	/* losing sight */
	    if (talk) {
		if (Hallucination)
		    pline("Oh, bummer!  Everything is dark!  Help!");
		else
		    pline("A cloud of darkness falls upon you.");
	    }
	    /* Before the hero goes blind, set the ball&chain variables. */
	    if (Punished) set_bc(0);
	} else if (!old && xtime) {
	    /* setting temporary blindness without toggling blindness */
	    if (talk) {
		if (!haseyes(youmonst.data)) {
		    strange_feeling(NULL, NULL);
		} else if (Blindfolded) {
		    strcpy(buf, body_part(EYE));
		    eyecnt = eyecount(youmonst.data);
		    pline(eyemsg, (eyecnt == 1) ? buf : makeplural(buf),
			 (eyecnt == 1) ? "twitches" : "twitch");
		} else {	/* Eyes of the Overworld */
		    pline(vismsg, "dim",
			 Hallucination ? "happier" : "normal");
		}
	    }
	}

	set_itimeout(&Blinded, xtime);

	if (u_could_see ^ can_see_now) {  /* one or the other but not both */
	    iflags.botl = 1;
	    vision_full_recalc = 1;	/* blindness just got toggled */
	    if (Blind_telepat || Infravision) see_monsters();
	}
}